

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
detail::reader::operator()
          (reader *this,vector<example::option_t,_std::allocator<example::option_t>_> *val)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  option_t v;
  date_type local_7c;
  time_duration_type local_78;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_70;
  option_t local_68;
  
  puVar1 = (ushort *)(this->buf_).data_;
  uVar2 = (this->buf_).size_;
  uVar4 = *puVar1;
  uVar3 = 2;
  if (uVar2 < 2) {
    uVar3 = uVar2;
  }
  (this->buf_).data_ = (void *)((long)puVar1 + uVar3);
  (this->buf_).size_ = uVar2 - uVar3;
  if (uVar4 != 0) {
    uVar4 = uVar4 << 8 | uVar4 >> 8;
    do {
      local_68.underlying_id.ptr_ = (char *)0x0;
      local_68.underlying_id.len_ = 0;
      local_68.contract_id.ptr_ = (char *)0x0;
      local_68.contract_id.len_ = 0;
      local_7c.
      super_date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
      .days_ = (date<boost::gregorian::date,_boost::gregorian::gregorian_calendar,_boost::gregorian::date_duration>
                )0xfffffffe;
      local_78.
      super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
      .ticks_.value_ =
           (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
            )(impl_type)0x7ffffffffffffffe;
      boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>::
      counted_time_rep(&local_70.time_,&local_7c,&local_78);
      local_68.expiration.
      super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
      .time_.time_count_.value_ =
           (base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
            )(base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
              )local_70.time_.time_count_.value_;
      local_68.putcall = 0;
      local_68.quote_ticks.super_optional<example::decimal_t>.super_type.m_storage.dummy_._2_6_ = 0;
      local_68.exercise.super_optional<example::exercise_t>.super_type =
           (optional<example::exercise_t>)0x0;
      local_68.quote_ticks.super_optional<example::decimal_t>.super_type.m_initialized = false;
      local_68.quote_ticks.super_optional<example::decimal_t>.super_type._1_3_ = 0;
      local_68.quote_ticks.super_optional<example::decimal_t>.super_type.m_storage.dummy_._0_2_ = 0;
      operator()(this,&local_68);
      std::vector<example::option_t,std::allocator<example::option_t>>::
      emplace_back<example::option_t&>
                ((vector<example::option_t,std::allocator<example::option_t>> *)val,&local_68);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void operator()(example::opt_fields) const {
        opts_.reset();
        optv_ = asio::buffer_cast<example::opt_fields::value_type*>(buf_);
        buf_ = buf_ + sizeof(example::opt_fields::value_type);
    }